

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

shared_ptr<QPDFObject> __thiscall QPDF::getObjectForParser(QPDF *this,int id,int gen,bool parse_pdf)

{
  long lVar1;
  long lVar2;
  _func_int **pp_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  iterator iVar5;
  const_iterator cVar6;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var7;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined4 in_register_00000034;
  long *plVar9;
  char in_R8B;
  shared_ptr<QPDFObject> sVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> pVar11;
  QPDFObjGen og;
  key_type local_58;
  pair<const_QPDFObjGen,_QPDF::ObjCache> local_50;
  
  plVar9 = (long *)CONCAT44(in_register_00000034,id);
  local_58.gen = (int)CONCAT71(in_register_00000009,parse_pdf);
  local_58.obj = gen;
  iVar5 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
          ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                  *)(*plVar9 + 0x1a8),&local_58);
  lVar1 = *plVar9;
  if (iVar5._M_node == (_Base_ptr)(lVar1 + 0x1b0)) {
    cVar6 = std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                    *)(lVar1 + 0x138),&local_58);
    lVar2 = *plVar9;
    if ((cVar6._M_node == (_Base_ptr)(lVar1 + 0x140)) && (*(char *)(lVar2 + 0x2d4) != '\0')) {
      if (in_R8B != '\0') {
        _Var7._M_head_impl = (Members *)operator_new(0x70);
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var7._M_head_impl)->log + 8))->
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
        *(undefined ***)&(_Var7._M_head_impl)->log = &PTR___Sp_counted_ptr_inplace_002eaaf0;
        *(undefined1 *)((long)&(_Var7._M_head_impl)->tokenizer + 0x28) = 2;
        ((string *)((long)&(_Var7._M_head_impl)->tokenizer + 0x30))->_M_dataplus = (pointer)0x0;
        *(size_type *)((long)&(_Var7._M_head_impl)->tokenizer + 0x38) = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)&(_Var7._M_head_impl)->tokenizer + 0x40))->_M_allocated_capacity = 0;
        *(undefined8 *)((long)&(_Var7._M_head_impl)->tokenizer + 0x48) = 0;
        ((string *)((long)&(_Var7._M_head_impl)->tokenizer + 0x50))->_M_dataplus =
             (pointer)0xffffffffffffffff;
        this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
        _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var7._M_head_impl;
        (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
        _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
             ((Members *)&(_Var7._M_head_impl)->unique_id)._M_head_impl;
        _Var8._M_pi = extraout_RDX_00;
        goto LAB_002303dd;
      }
      pp_Var3 = (_func_int **)CONCAT44(local_58.gen,local_58.obj);
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count = 1;
      (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_weak_count = 1;
      (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaf0;
      *(undefined1 *)
       &local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[4]._vptr__Sp_counted_base = 2;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._M_use_count = 0;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._M_weak_count = 0;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(long **)&local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi[5]._M_use_count = plVar9;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[6]._vptr__Sp_counted_base = pp_Var3;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[6]._M_use_count = -1;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[6]._M_weak_count = -1;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
      local_50.first.gen = local_58.gen;
      local_50.first.obj = local_58.obj;
      local_50.second.end_before_space = 0;
      local_50.second.end_after_space = 0;
      pVar11 = std::
               _Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
               ::_M_insert_unique<std::pair<QPDFObjGen_const,QPDF::ObjCache>>
                         ((_Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
                           *)(lVar2 + 0x1a8),&local_50);
    }
    else {
      pp_Var3 = (_func_int **)CONCAT44(local_58.gen,local_58.obj);
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count = 1;
      (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_weak_count = 1;
      (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaf0;
      *(undefined1 *)
       &local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[4]._vptr__Sp_counted_base = 0xd;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._M_use_count = 0;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._M_weak_count = 0;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(long **)&local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi[5]._M_use_count = plVar9;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[6]._vptr__Sp_counted_base = pp_Var3;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[6]._M_use_count = -1;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[6]._M_weak_count = -1;
      local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
      local_50.first.gen = local_58.gen;
      local_50.first.obj = local_58.obj;
      local_50.second.end_before_space = 0;
      local_50.second.end_after_space = 0;
      pVar11 = std::
               _Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
               ::_M_insert_unique<std::pair<QPDFObjGen_const,QPDF::ObjCache>>
                         ((_Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
                           *)(lVar2 + 0x1a8),&local_50);
    }
    _Var8._M_pi = pVar11._8_8_;
    (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (Members *)pVar11.first._M_node._M_node[1]._M_parent;
    _Var7._M_head_impl = (Members *)pVar11.first._M_node._M_node[1]._M_left;
    this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var7._M_head_impl != (Members *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(_Var7._M_head_impl)->log + 8);
        *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(_Var7._M_head_impl)->log + 8);
        *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
      }
    }
    if (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var8._M_pi = extraout_RDX_01;
    }
  }
  else {
    (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (Members *)iVar5._M_node[1]._M_parent;
    _Var7._M_head_impl = (Members *)iVar5._M_node[1]._M_left;
    this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var7._M_head_impl;
    _Var8._M_pi = extraout_RDX;
    if (_Var7._M_head_impl != (Members *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(_Var7._M_head_impl)->log + 8);
        *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(_Var7._M_head_impl)->log + 8);
        *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
      }
    }
  }
LAB_002303dd:
  sVar10.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
  sVar10.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar10.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObject>
QPDF::getObjectForParser(int id, int gen, bool parse_pdf)
{
    // This method is called by the parser and therefore must not resolve any objects.
    auto og = QPDFObjGen(id, gen);
    if (auto iter = m->obj_cache.find(og); iter != m->obj_cache.end()) {
        return iter->second.object;
    }
    if (m->xref_table.count(og) || !m->parsed) {
        return m->obj_cache.insert({og, QPDFObject::create<QPDF_Unresolved>(this, og)})
            .first->second.object;
    }
    if (parse_pdf) {
        return QPDFObject::create<QPDF_Null>();
    }
    return m->obj_cache.insert({og, QPDFObject::create<QPDF_Null>(this, og)}).first->second.object;
}